

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_ops.cc
# Opt level: O1

bool google::protobuf::internal::ReflectionOps::IsInitialized(Message *message)

{
  byte bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  Reflection *this;
  FieldDescriptor *pFVar6;
  Descriptor *pDVar7;
  MapFieldBase *this_00;
  MessageLite *pMVar8;
  string *psVar9;
  int iVar10;
  pointer ppFVar11;
  Metadata MVar12;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  fields;
  MapIterator iter;
  MapIterator end;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  local_108;
  pointer local_e8;
  MapIterator local_e0;
  MapIterator local_88;
  
  MVar12 = Message::GetMetadata(message);
  pDVar7 = MVar12.descriptor;
  this = GetReflectionOrDie(message);
  iVar5 = pDVar7->field_count_;
  if (0 < iVar5) {
    iVar10 = 0;
    do {
      pFVar6 = Descriptor::field(pDVar7,iVar10);
      bVar2 = FieldDescriptor::is_required(pFVar6);
      if (bVar2) {
        pFVar6 = Descriptor::field(pDVar7,iVar10);
        bVar2 = Reflection::HasField(this,message,pFVar6);
        if (!bVar2) {
          return false;
        }
      }
      iVar10 = iVar10 + 1;
    } while (iVar5 != iVar10);
  }
  local_108.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_108.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_108.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((pDVar7->options_->field_0)._impl_.map_entry_ == true) {
    local_e0.iter_.node_ = (NodeBase *)Descriptor::map_value(pDVar7);
    std::
    vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
    ::_M_assign_aux<google::protobuf::FieldDescriptor_const*const*>
              ((vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
                *)&local_108,&local_e0);
  }
  else {
    Reflection::ListFields(this,message,&local_108);
  }
  bVar2 = local_108.
          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          local_108.
          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          ._M_impl.super__Vector_impl_data._M_finish;
  local_e8 = local_108.
             super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  ppFVar11 = local_108.
             super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  while (!bVar2) {
    pFVar6 = *ppFVar11;
    if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)pFVar6->type_ * 4) != 10)
    goto LAB_002fdf9e;
    if ((pFVar6->type_ == 0xb) && (bVar3 = FieldDescriptor::is_map_message_type(pFVar6), bVar3)) {
      pDVar7 = FieldDescriptor::message_type(pFVar6);
      if ((long)pDVar7->field_count_ < 2) {
        psVar9 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                           (1,(long)pDVar7->field_count_,"index < field_count()");
      }
      else {
        psVar9 = (string *)0x0;
      }
      if (psVar9 != (string *)0x0) {
        absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_e0,
                   "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/descriptor.h"
                   ,0x9f4,*(undefined8 *)(psVar9 + 8),*(undefined8 *)psVar9);
        goto LAB_002fe0cf;
      }
      iVar5 = 6;
      if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)pDVar7->fields_[1].type_ * 4) == 10)
      {
        this_00 = Reflection::GetMapData(this,message,pFVar6);
        bVar3 = MapFieldBase::IsMapValid(this_00);
        iVar5 = 0;
        if (bVar3) {
          MapIterator::MapIterator(&local_e0,message,pFVar6);
          MapIterator::MapIterator(&local_88,message,pFVar6);
          MapFieldBase::MapBegin(this_00,&local_e0);
          MapFieldBase::MapEnd(this_00,&local_88);
          while (bVar3 = MapFieldBase::EqualIterator(local_e0.map_,&local_e0,&local_88), !bVar3) {
            pMVar8 = &MapValueConstRef::GetMessageValue(&local_e0.value_.super_MapValueConstRef)->
                      super_MessageLite;
            bVar3 = MessageLite::IsInitialized(pMVar8);
            if (!bVar3) {
              iVar5 = 1;
              goto LAB_002fdef4;
            }
            MapFieldBase::IncreaseIterator(local_e0.map_,&local_e0);
          }
          iVar5 = 6;
LAB_002fdef4:
          if ((local_88.key_.type_ == CPPTYPE_STRING) &&
             (local_88.key_.val_._0_8_ != (undefined1 *)((long)&local_88.key_.val_ + 0x10))) {
            operator_delete((void *)local_88.key_.val_.int64_value,local_88.key_.val_._16_8_ + 1);
          }
          if ((local_e0.key_.type_ == CPPTYPE_STRING) &&
             (local_e0.key_.val_._0_8_ != (undefined1 *)((long)&local_e0.key_.val_ + 0x10))) {
            operator_delete((void *)local_e0.key_.val_.int64_value,local_e0.key_.val_._16_8_ + 1);
          }
        }
      }
      if (iVar5 == 0) goto LAB_002fdf50;
      goto LAB_002fdfa1;
    }
LAB_002fdf50:
    bVar1 = pFVar6->field_0x1;
    bVar3 = (bool)((bVar1 & 0x20) >> 5);
    if (0xbf < bVar1 == bVar3) {
      psVar9 = (string *)0x0;
    }
    else {
      psVar9 = absl::lts_20240722::log_internal::MakeCheckOpString<bool,bool>
                         (bVar3,0xbf < bVar1,"is_repeated_ == label() == LABEL_REPEATED");
    }
    if (psVar9 != (string *)0x0) {
      absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_e0,
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/descriptor.h"
                 ,0xab7,*(undefined8 *)(psVar9 + 8),*(undefined8 *)psVar9);
LAB_002fe0cf:
      absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_e0);
    }
    if ((pFVar6->field_0x1 & 0x20) == 0) {
      pMVar8 = &Reflection::GetMessage(this,message,pFVar6,(MessageFactory *)0x0)->super_MessageLite
      ;
      bVar3 = MessageLite::IsInitialized(pMVar8);
      iVar5 = 1;
      if (bVar3) {
LAB_002fdf9e:
        iVar5 = 0;
      }
    }
    else {
      iVar5 = Reflection::FieldSize(this,message,pFVar6);
      bVar3 = 0 < iVar5;
      if (0 < iVar5) {
        iVar10 = 0;
        do {
          pMVar8 = &Reflection::GetRepeatedMessage(this,message,pFVar6,iVar10)->super_MessageLite;
          bVar4 = MessageLite::IsInitialized(pMVar8);
          if (!bVar4) {
            iVar5 = 1;
            goto LAB_002fe01a;
          }
          iVar10 = iVar10 + 1;
          bVar3 = iVar10 < iVar5;
        } while (iVar10 != iVar5);
      }
      iVar5 = 0;
LAB_002fe01a:
      if (!bVar3) goto LAB_002fdf9e;
    }
LAB_002fdfa1:
    if ((iVar5 != 6) && (iVar5 != 0)) break;
    ppFVar11 = ppFVar11 + 1;
    bVar2 = ppFVar11 == local_e8;
  }
  if (local_108.
      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_108.
                    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_108.
                          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_108.
                          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return bVar2;
}

Assistant:

bool ReflectionOps::IsInitialized(const Message& message) {
  const Descriptor* descriptor = message.GetDescriptor();
  const Reflection* reflection = GetReflectionOrDie(message);

  // Check required fields of this message.
  {
    const int field_count = descriptor->field_count();
    for (int i = 0; i < field_count; i++) {
      if (descriptor->field(i)->is_required()) {
        if (!reflection->HasField(message, descriptor->field(i))) {
          return false;
        }
      }
    }
  }

  // Check that sub-messages are initialized.
  std::vector<const FieldDescriptor*> fields;
  // Should be safe to skip stripped fields because required fields are not
  // stripped.
  if (descriptor->options().map_entry()) {
    // MapEntry objects always check the value regardless of has bit.
    // We don't need to bother with the key.
    fields = {descriptor->map_value()};
  } else {
    reflection->ListFields(message, &fields);
  }
  for (const FieldDescriptor* field : fields) {
    if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {

      if (field->is_map()) {
        const FieldDescriptor* value_field = field->message_type()->field(1);
        if (value_field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
          const MapFieldBase* map_field =
              reflection->GetMapData(message, field);
          if (map_field->IsMapValid()) {
            MapIterator iter(const_cast<Message*>(&message), field);
            MapIterator end(const_cast<Message*>(&message), field);
            for (map_field->MapBegin(&iter), map_field->MapEnd(&end);
                 iter != end; ++iter) {
              if (!iter.GetValueRef().GetMessageValue().IsInitialized()) {
                return false;
              }
            }
            continue;
          }
        } else {
          continue;
        }
      }

      if (field->is_repeated()) {
        int size = reflection->FieldSize(message, field);

        for (int j = 0; j < size; j++) {
          if (!reflection->GetRepeatedMessage(message, field, j)
                   .IsInitialized()) {
            return false;
          }
        }
      } else {
        if (!reflection->GetMessage(message, field).IsInitialized()) {
          return false;
        }
      }
    }
  }

  return true;
}